

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aig.h
# Opt level: O2

int Aig_ObjWhatFanin(Aig_Obj_t *pObj,Aig_Obj_t *pFanin)

{
  if ((Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe) == pFanin) {
    return 0;
  }
  if ((Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe) == pFanin) {
    return 1;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                ,0x150,"int Aig_ObjWhatFanin(Aig_Obj_t *, Aig_Obj_t *)");
}

Assistant:

static inline int          Aig_ObjWhatFanin( Aig_Obj_t * pObj, Aig_Obj_t * pFanin )    
{ 
    if ( Aig_ObjFanin0(pObj) == pFanin ) return 0; 
    if ( Aig_ObjFanin1(pObj) == pFanin ) return 1; 
    assert(0); return -1; 
}